

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreClient.cpp
# Opt level: O0

Enum __thiscall
ViconDataStreamSDK::Core::VClient::SetTimingLog
          (VClient *this,string *i_rClientLog,string *i_rCGStreamLog)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  Enum EVar4;
  element_type *this_00;
  element_type *peVar5;
  byte local_41;
  byte local_32;
  Enum Output;
  bool bCGStreamLogOK;
  bool bClientLogOk;
  string *local_20;
  string *i_rCGStreamLog_local;
  string *i_rClientLog_local;
  VClient *this_local;
  
  local_20 = i_rCGStreamLog;
  i_rCGStreamLog_local = i_rClientLog;
  i_rClientLog_local = (string *)this;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->m_pTimingLog);
  if (!bVar1) {
    std::make_shared<ViconDataStreamSDK::Core::VClientTimingLog>();
    std::shared_ptr<ViconDataStreamSDK::Core::VClientTimingLog>::operator=
              (&this->m_pTimingLog,(shared_ptr<ViconDataStreamSDK::Core::VClientTimingLog> *)&Output
              );
    std::shared_ptr<ViconDataStreamSDK::Core::VClientTimingLog>::~shared_ptr
              ((shared_ptr<ViconDataStreamSDK::Core::VClientTimingLog> *)&Output);
  }
  this_00 = std::
            __shared_ptr_access<ViconDataStreamSDK::Core::VClientTimingLog,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<ViconDataStreamSDK::Core::VClientTimingLog,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->m_pTimingLog);
  bVar1 = VClientTimingLog::CreateLog(this_00,i_rCGStreamLog_local);
  local_32 = 1;
  bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->m_pClient);
  if (bVar2) {
    peVar5 = std::
             __shared_ptr_access<ViconCGStreamClientSDK::ICGClient,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<ViconCGStreamClientSDK::ICGClient,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->m_pClient);
    iVar3 = (*peVar5->_vptr_ICGClient[0x18])(peVar5,local_20);
    local_32 = (byte)iVar3 & 1;
  }
  else {
    std::__cxx11::string::operator=((string *)&this->m_ClientLogFile,(string *)local_20);
  }
  local_41 = 0;
  if (bVar1) {
    local_41 = local_32;
  }
  EVar4 = InvalidOperation;
  if (local_41 != 0) {
    EVar4 = Success;
  }
  return EVar4;
}

Assistant:

Result::Enum VClient::SetTimingLog(const std::string & i_rClientLog, const std::string & i_rCGStreamLog )
{
  if (!m_pTimingLog)
  {
    m_pTimingLog = std::make_shared< VClientTimingLog >();
  }

  bool bClientLogOk = m_pTimingLog->CreateLog(i_rClientLog);
  bool bCGStreamLogOK = true;
  if( m_pClient )
  {
    bCGStreamLogOK = m_pClient->SetLogFile(i_rCGStreamLog);
  }
  else
  {
    m_ClientLogFile = i_rCGStreamLog;
  }

  Result::Enum Output = ( bClientLogOk && bCGStreamLogOK ) ? Result::Success : Result::InvalidOperation;
  return Output;
}